

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

wchar_t count_feats(loc *grid,_func__Bool_chunk_ptr_loc *test,_Bool under)

{
  _Bool _Var1;
  loc grid_00;
  long lVar2;
  wchar_t local_3c;
  
  local_3c = L'\0';
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 8) {
    if (lVar2 != 0x40 || under) {
      grid_00 = (loc)loc_sum(player->grid,*(loc_conflict *)((long)&ddgrid_ddd[0].x + lVar2));
      _Var1 = square_in_bounds_fully(cave,grid_00);
      if (_Var1) {
        _Var1 = square_isknown(cave,grid_00);
        if (_Var1) {
          _Var1 = (*test)((chunk_conflict *)player->cave,grid_00);
          if ((_Var1) && (local_3c = local_3c + L'\x01', grid != (loc *)0x0)) {
            *grid = grid_00;
          }
        }
      }
    }
  }
  return local_3c;
}

Assistant:

int count_feats(struct loc *grid,
				bool (*test)(struct chunk *c, struct loc grid), bool under)
{
	int d;
	struct loc grid1;
	int count = 0; /* Count how many matches */

	/* Check around (and under) the character */
	for (d = 0; d < 9; d++) {
		/* if not searching under player continue */
		if ((d == 8) && !under) continue;

		/* Extract adjacent (legal) location */
		grid1 = loc_sum(player->grid, ddgrid_ddd[d]);

		/* Paranoia */
		if (!square_in_bounds_fully(cave, grid1)) continue;

		/* Must have knowledge */
		if (!square_isknown(cave, grid1)) continue;

		/* Not looking for this feature; test against player's memory */
		if (!((*test)(player->cave, grid1))) continue;

		/* Count it */
		++count;

		/* Remember the location of the last match */
		if (grid) {
			*grid = grid1;
		}
	}

	/* All done */
	return count;
}